

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O0

bool __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,string *path)

{
  bool bVar1;
  xr_reader *local_30;
  xr_reader *r;
  xr_file_system *fs;
  string *path_local;
  xr_gamemtls_lib *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (string *)this;
  r = (xr_reader *)xr_file_system::instance();
  local_30 = xr_file_system::r_open((xr_file_system *)r,(string *)fs);
  bVar1 = local_30 != (xr_reader *)0x0;
  if (bVar1) {
    load(this,local_30);
    xr_file_system::r_close((xr_file_system *)r,&local_30);
  }
  return bVar1;
}

Assistant:

bool xr_gamemtls_lib::load(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	load(*r);
	fs.r_close(r);
	return true;
}